

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_MissingFunctionArgumentInCallThrows_Test::
~SemanticAnalyserTest_MissingFunctionArgumentInCallThrows_Test
          (SemanticAnalyserTest_MissingFunctionArgumentInCallThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, MissingFunctionArgumentInCallThrows)
{
  std::string source = R"SRC(
  fn test(x: f32, y: f32): f32
  {
    ret x + y;
  }

  fn main(): f32
  {
    let x: f32 = 12;
    test(x);
    ret 0;
  }
  )SRC";
  throwTest(source);
}